

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::Append4(char *out,AlphaNum *x1,AlphaNum *x2,AlphaNum *x3,AlphaNum *x4)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  AlphaNum *in_RCX;
  AlphaNum *in_RDX;
  AlphaNum *in_RSI;
  void *in_RDI;
  AlphaNum *in_R8;
  
  pcVar1 = strings::AlphaNum::data(in_RSI);
  sVar2 = strings::AlphaNum::size(in_RSI);
  memcpy(in_RDI,pcVar1,sVar2);
  sVar2 = strings::AlphaNum::size(in_RSI);
  pcVar1 = strings::AlphaNum::data(in_RDX);
  sVar3 = strings::AlphaNum::size(in_RDX);
  memcpy((void *)(sVar2 + (long)in_RDI),pcVar1,sVar3);
  sVar3 = strings::AlphaNum::size(in_RDX);
  pvVar4 = (void *)(sVar3 + (long)(sVar2 + (long)in_RDI));
  pcVar1 = strings::AlphaNum::data(in_RCX);
  sVar2 = strings::AlphaNum::size(in_RCX);
  memcpy(pvVar4,pcVar1,sVar2);
  sVar2 = strings::AlphaNum::size(in_RCX);
  pvVar4 = (void *)(sVar2 + (long)pvVar4);
  pcVar1 = strings::AlphaNum::data(in_R8);
  sVar2 = strings::AlphaNum::size(in_R8);
  memcpy(pvVar4,pcVar1,sVar2);
  sVar2 = strings::AlphaNum::size(in_R8);
  return (char *)((long)pvVar4 + sVar2);
}

Assistant:

static char *Append4(char *out,
                     const AlphaNum &x1, const AlphaNum &x2,
                     const AlphaNum &x3, const AlphaNum &x4) {
  memcpy(out, x1.data(), x1.size());
  out += x1.size();

  memcpy(out, x2.data(), x2.size());
  out += x2.size();

  memcpy(out, x3.data(), x3.size());
  out += x3.size();

  memcpy(out, x4.data(), x4.size());
  return out + x4.size();
}